

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_info.cpp
# Opt level: O2

bool nodecpp::stack_info_impl::stackPointerToInfo(void *ptr,StackFrameInfo *info)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  long lVar7;
  undefined1 auVar8 [16];
  string r;
  string local_90;
  basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
  local_70;
  Dl_info info_1;
  
  iVar4 = dladdr(ptr,&info_1);
  if (iVar4 != 0) {
    info->offset = (uintptr_t)ptr;
    info->offset2 = (long)ptr - (long)info_1.dli_fbase;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
    ::assign(&info->modulePath,info_1.dli_fname);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
    ::basic_string((basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                    *)&info_1,&info->modulePath);
    callAddr2Line(&r,(basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                      *)&info_1,info->offset);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                     *)&info_1);
    bVar3 = std::operator==(&r,"??\n??:0\n");
    if ((bVar3) && (info->offset2 != 0)) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
      ::basic_string(&local_70,&info->modulePath);
      callAddr2Line(&local_90,&local_70,info->offset2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&r,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
      ::~basic_string(&local_70);
      uVar1 = info->offset;
      uVar2 = info->offset2;
      auVar8._8_4_ = (int)uVar1;
      auVar8._0_8_ = uVar2;
      auVar8._12_4_ = (int)((ulong)uVar1 >> 0x20);
      info->offset = uVar2;
      info->offset2 = auVar8._8_8_;
    }
    if (r._M_string_length != 0) {
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&r,'\n',0);
      if (sVar5 == 0xffffffffffffffff) {
        std::__cxx11::
        basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
        ::assign<std::__cxx11::string>
                  ((basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
                    *)&info->functionName,&r);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_90,&r,0,sVar5);
        std::__cxx11::
        basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
        ::assign<std::__cxx11::string>
                  ((basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
                    *)&info->functionName,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        bVar3 = std::operator==(&info->functionName,"??");
        if (bVar3) {
          (info->functionName)._M_string_length = 0;
          *(info->functionName)._M_dataplus._M_p = '\0';
        }
        sVar5 = sVar5 + 1;
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&r,':',sVar5);
        if (sVar6 != 0xffffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_90,&r,sVar5,sVar6 - sVar5);
          std::__cxx11::
          basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
          ::assign<std::__cxx11::string>
                    ((basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
                      *)&info->srcPath,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          bVar3 = std::operator==(&info->srcPath,"??");
          if (bVar3) {
            (info->srcPath)._M_string_length = 0;
            *(info->srcPath)._M_dataplus._M_p = '\0';
          }
          lVar7 = atol(r._M_dataplus._M_p + sVar6 + 1);
          info->line = (int)lVar7;
        }
      }
    }
    std::__cxx11::string::~string((string *)&r);
  }
  return iVar4 != 0;
}

Assistant:

bool stackPointerToInfo( void* ptr, nodecpp::stack_info_impl::StackFrameInfo& info )
	{
	#if defined(NODECPP_WINDOWS)

		static constexpr size_t TRACE_MAX_FUNCTION_NAME_LENGTH = 1024;
		HANDLE process = GetCurrentProcess();
		uint8_t symbolBuff[ sizeof(SYMBOL_INFO) + (TRACE_MAX_FUNCTION_NAME_LENGTH - 1) * sizeof(TCHAR) ];
		SYMBOL_INFO *symbol = (SYMBOL_INFO *)symbolBuff;
		symbol->MaxNameLen = TRACE_MAX_FUNCTION_NAME_LENGTH;
		symbol->SizeOfStruct = sizeof(SYMBOL_INFO);
		DWORD displacement = 0;
		IMAGEHLP_LINE64 line;
		DWORD64 address = (DWORD64)(ptr);
		bool addrOK = false;
	#ifndef _DEBUG
		addrOK = SymFromAddr(process, address, NULL, symbol);
	#endif
		bool fileLineOK = SymGetLineFromAddr64(process, address, &displacement, &line);

		if ( fileLineOK )
		{
			info.srcPath = line.FileName;
			info.line = line.LineNumber;
		}
		if ( addrOK )
			info.functionName = symbol->Name;
		return true;

	#elif defined(NODECPP_LINUX) && defined(NODECPP_GCC)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			useAddr2Line( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_LINUX) && defined(NODECPP_CLANG)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			// mb: I see strange behaviour on clang on linux.
			// when we are the main executable, ptr returned by
			// backtrace is already an offset. But is an absolute
			// address when we are a dynamic load library
			info.offset = reinterpret_cast<uintptr_t>(ptr);
			info.offset2 = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			useAddr2Line( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_MAC)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			// mb: addr2line is not found on mac, use atos
			useAtos( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_ANDROID)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			// mb: clang on android behaves as gcc on linux,
			// and not as clang on linux
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;

			// mb: addr2line is not present on the device, is on the host where cross compile took place, i.e.
			// %ANDROID_HOME%\ndk\24.0.8215888\toolchains\llvm\prebuilt\windows-x86_64\bin\llvm-addr2line.exe
			// useAddr2Line( info );
			return true;
		}
		else
			return false;

	#else
	#error platform not (yet) supported, use NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
	#endif // platform/compiler
	}